

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIFT.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  pointer peVar5;
  Size SVar6;
  Size SVar7;
  ostream *poVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  int in_R8D;
  extrema *e_1;
  pointer peVar13;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> matchKP1;
  vector<extrema,_std::allocator<extrema>_> ex2;
  vector<extrema,_std::allocator<extrema>_> ex1;
  Mat matches;
  uint cnt_match;
  uint n_pixels2;
  uint n_pixels1;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> matchKP2;
  Mat colorfulImage;
  Mat colorfulImage2;
  Mat image2;
  Mat image;
  undefined1 local_308 [24];
  undefined8 uStack_2f0;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_2e8;
  undefined1 local_2c8 [12];
  float fStack_2bc;
  Size local_2b8;
  vector<extrema,_std::allocator<extrema>_> local_2a8;
  undefined1 local_288 [12];
  float fStack_27c;
  undefined1 local_278 [8];
  uchar *puStack_270;
  uchar *puStack_268;
  vector<double,_std::allocator<double>_> local_260;
  vector<double,_std::allocator<double>_> local_248;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_230;
  uint local_214;
  uint local_210;
  uint local_20c;
  int local_208;
  int local_204;
  int local_200;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_1e8;
  _InputArray local_1c8;
  undefined1 local_1b0 [96];
  undefined1 local_150 [96];
  undefined1 local_f0 [8];
  pointer peStack_e8;
  undefined1 auStack_e0 [176];
  
  local_2a8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_2a8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2a8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2b8 = (Size)0x0;
  local_2c8._0_8_ = (pointer)0x0;
  local_2c8._8_4_ = 0;
  fStack_2bc = 0.0;
  cv::Mat::Mat((Mat *)(auStack_e0 + 0x50));
  cv::Mat::Mat((Mat *)local_1b0);
  local_f0 = (undefined1  [8])auStack_e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"/Users/hsjimwang/Desktop/SIFT/cookbeef1.jpg","");
  cv::imread((string *)local_288,(int)local_f0);
  cv::Mat::operator=((Mat *)local_1b0,(Mat *)local_288);
  cv::Mat::~Mat((Mat *)local_288);
  if (local_f0 != (undefined1  [8])auStack_e0) {
    operator_delete((void *)local_f0,auStack_e0._0_8_ + 1);
  }
  local_278 = (undefined1  [8])0x0;
  local_288._0_4_ = 0x1010000;
  auStack_e0._0_4_ = 0;
  auStack_e0._4_4_ = 0;
  local_f0._0_4_ = 0x2010000;
  unique0x10001331 = (pointer)local_1b0;
  peStack_e8 = (pointer)(auStack_e0 + 0x50);
  cv::cvtColor((cv *)local_288,(_InputArray *)local_f0,(_OutputArray *)0x6,0,in_R8D);
  rescale((Mat *)local_1b0,(Mat *)(auStack_e0 + 0x50));
  SIFTDescript((vector<extrema,_std::allocator<extrema>_> *)local_f0,(Mat *)(auStack_e0 + 0x50),
               &local_20c);
  local_278 = (undefined1  [8])
              local_2a8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  unique0x100012e1 =
       local_2a8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_288._0_8_ =
       local_2a8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_2a8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_f0;
  local_2a8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.super__Vector_impl_data.
  _M_finish = peStack_e8;
  local_2a8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)auStack_e0._0_8_;
  local_f0 = (undefined1  [8])0x0;
  peStack_e8 = (pointer)0x0;
  auStack_e0._0_4_ = 0;
  auStack_e0._4_4_ = 0;
  std::vector<extrema,_std::allocator<extrema>_>::~vector
            ((vector<extrema,_std::allocator<extrema>_> *)local_288);
  std::vector<extrema,_std::allocator<extrema>_>::~vector
            ((vector<extrema,_std::allocator<extrema>_> *)local_f0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"From ",5);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," point, ",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"we extracted ",0xd);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," interest points.",0x11);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  cv::Mat::Mat((Mat *)local_f0);
  cv::Mat::Mat((Mat *)local_150);
  local_308._0_8_ = local_308 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_308,"/Users/hsjimwang/Desktop/SIFT/cookbeef2.jpg","");
  cv::imread((string *)local_288,(int)local_308);
  cv::Mat::operator=((Mat *)local_150,(Mat *)local_288);
  cv::Mat::~Mat((Mat *)local_288);
  if ((pointer)local_308._0_8_ != (pointer)(local_308 + 0x10)) {
    operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
  }
  local_278 = (undefined1  [8])0x0;
  local_288._0_4_ = 0x1010000;
  local_308._16_4_ = 0;
  local_308._20_4_ = 0;
  local_308._0_4_ = 0x2010000;
  local_308._8_8_ = (pointer)local_f0;
  unique0x10001339 = (pointer)local_150;
  cv::cvtColor((cv *)local_288,(_InputArray *)local_308,(_OutputArray *)0x6,0,in_R8D);
  rescale((Mat *)local_150,(Mat *)local_f0);
  SIFTDescript((vector<extrema,_std::allocator<extrema>_> *)local_308,(Mat *)local_f0,&local_210);
  SVar6 = local_2b8;
  fStack_27c = fStack_2bc;
  local_288._8_4_ = local_2c8._8_4_;
  local_288._0_8_ = local_2c8._0_8_;
  local_2c8._0_8_ = local_308._0_8_;
  stack0xfffffffffffffd40 = (pointer)local_308._8_8_;
  local_2b8.width = local_308._16_4_;
  local_2b8.height = local_308._20_4_;
  SVar7 = local_2b8;
  local_2b8.width = SVar6.width;
  local_2b8.height = SVar6.height;
  local_278._0_4_ = local_2b8.width;
  local_278._4_4_ = local_2b8.height;
  local_308._0_8_ = (pointer)0x0;
  local_308._8_8_ = (pointer)0x0;
  local_308._16_4_ = 0;
  local_308._20_4_ = 0;
  local_2b8 = SVar7;
  std::vector<extrema,_std::allocator<extrema>_>::~vector
            ((vector<extrema,_std::allocator<extrema>_> *)local_288);
  std::vector<extrema,_std::allocator<extrema>_>::~vector
            ((vector<extrema,_std::allocator<extrema>_> *)local_308);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"From ",5);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," point, ",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"we extracted ",0xd);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," interest points.",0x11);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  peVar5 = stack0xfffffffffffffd40;
  if ((pointer)local_2c8._0_8_ != stack0xfffffffffffffd40) {
    peVar13 = (pointer)local_2c8._0_8_;
    do {
      local_288._8_4_ = peVar13->layer;
      local_288._0_8_ = peVar13->octave;
      fStack_27c = (peVar13->pt).x;
      local_278._0_4_ = (peVar13->pt).y;
      puStack_270 = (uchar *)peVar13->angle;
      puStack_268 = (uchar *)peVar13->magnitude;
      std::vector<double,_std::allocator<double>_>::vector(&local_260,&peVar13->keypoint_bin);
      std::vector<double,_std::allocator<double>_>::vector(&local_248,&peVar13->cell_bin);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector(&local_230,&peVar13->NeighborCells);
      local_2e8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1f0 = (int)ROUND(fStack_27c);
      local_2e8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_2e8.
                             super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,0x3010000);
      local_1ec = (int)ROUND((float)local_278._0_4_);
      local_2e8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_150;
      local_308._0_8_ = (pointer)0x0;
      local_308._8_8_ = (pointer)0x406fe00000000000;
      local_308._16_4_ = 0;
      local_308._20_4_ = 0x406fe000;
      uStack_2f0 = 0;
      cv::circle(&local_2e8,&local_1f0,3,local_308,1,8,0);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_230);
      if (local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      peVar13 = peVar13 + 1;
    } while (peVar13 != peVar5);
  }
  peVar5 = local_2a8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_2a8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_2a8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    peVar13 = local_2a8.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_308._16_4_ = 0;
      local_308._20_4_ = 0;
      local_308._0_4_ = 0x3010000;
      local_308._8_8_ = local_1b0;
      local_1f8 = (int)ROUND((peVar13->pt).x);
      local_1f4 = (int)ROUND((peVar13->pt).y);
      local_288._0_8_ = (pointer)0x0;
      local_288._8_4_ = 0;
      fStack_27c = 3.7480469;
      local_278 = (undefined1  [8])0x406fe00000000000;
      puStack_270 = (uchar *)0x0;
      cv::circle(local_308,&local_1f8,3,local_288,1,8,0);
      peVar13 = peVar13 + 1;
    } while (peVar13 != peVar5);
  }
  local_288._0_8_ = (pointer)local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"show","");
  local_308._16_4_ = 0;
  local_308._20_4_ = 0;
  local_308._0_4_ = 0x1010000;
  local_308._8_8_ = local_1b0;
  cv::imshow((string *)local_288,(_InputArray *)local_308);
  if ((pointer)local_288._0_8_ != (pointer)local_278) {
    operator_delete((void *)local_288._0_8_,(ulong)((long)(double *)local_278 + 1));
  }
  cv::waitKey(0);
  local_288._0_8_ = (pointer)local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"show","");
  local_308._16_4_ = 0;
  local_308._20_4_ = 0;
  local_308._0_4_ = 0x1010000;
  local_308._8_8_ = local_150;
  cv::imshow((string *)local_288,(_InputArray *)local_308);
  if ((pointer)local_288._0_8_ != (pointer)local_278) {
    operator_delete((void *)local_288._0_8_,(ulong)((long)(double *)local_278 + 1));
  }
  cv::waitKey(0);
  local_2e8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_214 = 0;
  findMatches(&local_2a8,(vector<extrema,_std::allocator<extrema>_> *)local_2c8,&local_2e8,
              &local_1e8,&local_214);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"We matched ",0xb);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," pairs.",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  iVar3 = local_150._8_4_;
  if ((int)local_150._8_4_ < (int)local_1b0._8_4_) {
    iVar3 = local_1b0._8_4_;
  }
  cv::Mat::Mat((Mat *)local_288,iVar3,local_150._12_4_ + local_1b0._12_4_,0x10);
  if (0 < (int)local_1b0._8_4_) {
    lVar9 = 0;
    do {
      if (0 < (int)local_1b0._12_4_) {
        lVar10 = 0;
        lVar11 = 0;
        do {
          dVar1 = *(double *)local_1b0._72_8_;
          dVar2 = *local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          *(uchar *)((long)(double *)local_278 + lVar10 + 2 + (long)dVar2 * lVar9) =
               *(uchar *)(local_1b0._16_8_ + lVar10 + 2 + (long)dVar1 * lVar9);
          *(undefined2 *)((long)(double *)local_278 + lVar10 + (long)dVar2 * lVar9) =
               *(undefined2 *)(local_1b0._16_8_ + lVar10 + (long)dVar1 * lVar9);
          lVar11 = lVar11 + 1;
          lVar10 = lVar10 + 3;
        } while (lVar11 < (int)local_1b0._12_4_);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (int)local_1b0._8_4_);
  }
  if (0 < (int)local_150._8_4_) {
    lVar9 = 0;
    do {
      if (0 < (int)local_150._12_4_) {
        lVar10 = 0;
        lVar11 = 0;
        do {
          dVar1 = *(double *)local_150._72_8_;
          dVar2 = *local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          lVar4 = ((int)local_1b0._12_4_ + lVar11) * 3;
          *(uchar *)((long)(double *)local_278 + lVar4 + (long)dVar2 * lVar9 + 2) =
               *(uchar *)(local_150._16_8_ + lVar10 + 2 + (long)dVar1 * lVar9);
          *(undefined2 *)((long)(double *)local_278 + lVar4 + (long)dVar2 * lVar9) =
               *(undefined2 *)(local_150._16_8_ + lVar10 + (long)dVar1 * lVar9);
          lVar11 = lVar11 + 1;
          lVar10 = lVar10 + 3;
        } while (lVar11 < (int)local_150._12_4_);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (int)local_150._8_4_);
  }
  if (local_2e8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_2e8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar12 = 0;
    do {
      local_1c8.sz.width = 0;
      local_1c8.sz.height = 0;
      local_1c8.flags = 0x3010000;
      local_1c8.obj = local_288;
      local_200 = local_2e8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar12].x;
      local_1fc = local_2e8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar12].y;
      local_208 = local_1b0._12_4_ +
                  local_1e8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar12].x;
      local_204 = local_1e8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar12].y;
      local_308._0_8_ = (pointer)0x4069000000000000;
      local_308._8_8_ = (pointer)0x4069000000000000;
      local_308._16_4_ = 0;
      local_308._20_4_ = 0;
      uStack_2f0 = 0;
      cv::line(&local_1c8,&local_200,&local_208,local_308,1,8,0);
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)((long)local_2e8.
                                    super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_2e8.
                                    super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  local_308._0_8_ = local_308 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"ShowMatches","");
  local_1c8.sz.width = 0;
  local_1c8.sz.height = 0;
  local_1c8.flags = 0x1010000;
  local_1c8.obj = local_288;
  cv::imshow((string *)local_308,&local_1c8);
  if ((pointer)local_308._0_8_ != (pointer)(local_308 + 0x10)) {
    operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
  }
  cv::waitKey(0);
  cv::Mat::~Mat((Mat *)local_288);
  if (local_1e8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.
                          super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.
                          super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.
                          super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.
                          super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  cv::Mat::~Mat((Mat *)local_150);
  cv::Mat::~Mat((Mat *)local_f0);
  cv::Mat::~Mat((Mat *)local_1b0);
  cv::Mat::~Mat((Mat *)(auStack_e0 + 0x50));
  std::vector<extrema,_std::allocator<extrema>_>::~vector
            ((vector<extrema,_std::allocator<extrema>_> *)local_2c8);
  std::vector<extrema,_std::allocator<extrema>_>::~vector(&local_2a8);
  return 0;
}

Assistant:

int main( int argc, char** argv )
{
    vector<extrema> ex1, ex2;
    Mat image, colorfulImage;
    unsigned n_pixels1, n_pixels2;
    colorfulImage = imread("/Users/hsjimwang/Desktop/SIFT/cookbeef1.jpg");
    cvtColor(colorfulImage, image, COLOR_BGR2GRAY);
    rescale(colorfulImage, image);
    ex1 = SIFTDescript(image, n_pixels1);
    cout << "From " << n_pixels1 << " point, ";
    cout << "we extracted " << ex1.size() << " interest points." << endl;

    Mat image2, colorfulImage2;
    colorfulImage2 = imread("/Users/hsjimwang/Desktop/SIFT/cookbeef2.jpg");
    cvtColor(colorfulImage2, image2, COLOR_BGR2GRAY);
    rescale(colorfulImage2, image2);
    ex2 = SIFTDescript(image2, n_pixels2);
    cout << "From " << n_pixels2 << " point, ";
    cout << "we extracted " << ex2.size() << " interest points." << endl;
    for(auto e:ex2){
        circle(colorfulImage2, e.pt, 3, Scalar(0,255,255));
    }

    for(const auto& e:ex1){
        circle(colorfulImage, e.pt, 3, Scalar(0,255,255));
    }

    imshow("show", colorfulImage);
    waitKey(0);
    imshow("show", colorfulImage2);
    waitKey(0);

    vector<Point> matchKP1, matchKP2;
    unsigned cnt_match = 0;
    findMatches(ex1, ex2, matchKP1, matchKP2, cnt_match);
    cout << "We matched " << cnt_match << " pairs." << endl;

    // Show the matches
    int height = colorfulImage.rows;
    if(colorfulImage.rows < colorfulImage2.rows) height = colorfulImage2.rows;
     Mat matches(height, colorfulImage.cols + colorfulImage2.cols, CV_8UC3);
    for(int r = 0; r < colorfulImage.rows; r++){
        for(int c = 0; c < colorfulImage.cols; c++)
            matches.at<Vec3b>(r,c) = colorfulImage.at<Vec3b>(r,c);
    }
    for(int r = 0; r < colorfulImage2.rows; r++){
        for(int c = 0; c < colorfulImage2.cols; c++)
            matches.at<Vec3b>(r,c+colorfulImage.cols) = colorfulImage2.at<Vec3b>(r,c);
    }
    for(int i=0; i<matchKP1.size(); i++){
        line(matches,matchKP1[i],Point(matchKP2[i].x+colorfulImage.cols, matchKP2[i].y),Scalar(200,200,0));
    }
    imshow("ShowMatches", matches);
    waitKey(0);
    return 0;
}